

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O2

flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
* __thiscall
iffl::
flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
::operator++(flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
             *this)

{
  ulong *puVar1;
  ulong uVar2;
  
  puVar1 = (ulong *)this->p_;
  uVar2 = *puVar1;
  if (uVar2 == 0) {
    uVar2 = puVar1[2] + 0x1f & 0xfffffffffffffff8;
  }
  this->p_ = (buffer_char_pointer)((long)puVar1 + uVar2);
  return this;
}

Assistant:

constexpr flat_forward_list_iterator_t &operator++() noexcept {
        size_t const next_offset = traits_traits::get_next_offset(p_);
        if (0 == next_offset) {
            size_with_padding_t const element_size{ traits_traits::get_size(p_) };
            p_ += element_size.size_padded();
        } else {
            p_ += next_offset;
        }
        return *this;
    }